

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_gamma_lut.h
# Opt level: O3

void __thiscall agg::sRGB_lut<float>::sRGB_lut(sRGB_lut<float> *this)

{
  int i;
  long lVar1;
  double dVar2;
  
  lVar1 = 0;
  do {
    dVar2 = (double)(int)lVar1 / 255.0;
    if (dVar2 <= 0.04045) {
      dVar2 = dVar2 / 12.92;
    }
    else {
      dVar2 = pow((dVar2 + 0.055) / 1.055,2.4);
    }
    this->m_dir_table[lVar1] = (float)dVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x100);
  lVar1 = 0;
  do {
    dVar2 = (double)(int)lVar1 / 65535.0;
    if (dVar2 <= 0.0031308) {
      dVar2 = dVar2 * 12.92;
    }
    else {
      dVar2 = pow(dVar2,0.4166666666666667);
      dVar2 = dVar2 * 1.055 + -0.055;
    }
    this->m_inv_table[lVar1] = (int8u)(long)(dVar2 * 255.0 + 0.5);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10000);
  return;
}

Assistant:

sRGB_lut()
		{
			// Generate lookup tables.
			for (int i = 0; i <= 255; ++i)
			{
				m_dir_table[i] = float(sRGB_to_linear(i / 255.0));
			}
			for (int i = 0; i <= 65535; ++i)
			{
				m_inv_table[i] = uround(255.0 * linear_to_sRGB(i / 65535.0));
			}
		}